

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O3

void __thiscall isSameTopology::test_method(isSameTopology *this)

{
  S2 s2;
  CartesianProduct cp;
  SO3<mnf::ExpMapMatrix> so3;
  RealSpace R9;
  RealSpace R3;
  RealSpace R9b;
  shared_count sStack_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined **local_4a0;
  undefined1 local_498;
  undefined8 *local_490;
  char **local_488;
  S2 local_480 [136];
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  code *local_2d8 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_280 [24];
  void *local_268;
  void *local_250;
  SO3<mnf::ExpMapMatrix> local_238;
  code *local_198 [11];
  void *local_140;
  void *local_130;
  code *local_120 [11];
  void *local_c8;
  void *local_b8;
  code *local_a8 [11];
  void *local_50;
  void *local_40;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_198,9);
  mnf::RealSpace::RealSpace((RealSpace *)local_a8,9);
  mnf::RealSpace::RealSpace((RealSpace *)local_120,3);
  mnf::S2::S2(local_480);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_238);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_2d8,&local_238.super_Manifold,(Manifold *)local_198);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0xf5);
  mnf::S2::isSameTopology((Manifold *)local_480);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(R9)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00124c88;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_300 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0xf6);
  mnf::S2::isSameTopology((Manifold *)local_480);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(R9b)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00124c88;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_330 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_348,0xf7);
  mnf::S2::isSameTopology((Manifold *)local_480);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(R3)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00124c88;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_360 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_378,0xf8);
  mnf::S2::isSameTopology((Manifold *)local_480);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "s2.isSameTopology(s2)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00124c88;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_390 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a8,0xf9);
  mnf::S2::isSameTopology((Manifold *)local_480);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(so3)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00124c88;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_3c0 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d8,0xfa);
  mnf::S2::isSameTopology((Manifold *)local_480);
  sStack_4b8.pi_ = (sp_counted_base *)0x0;
  local_4b0 = "!s2.isSameTopology(cp)";
  local_4a8 = "";
  local_498 = 0;
  local_4a0 = &PTR__lazy_ostream_00124c88;
  local_490 = &boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_3f0 = "";
  local_488 = &local_4b0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b8);
  local_2d8[0] = free;
  if (local_250 != (void *)0x0) {
    operator_delete(local_250);
  }
  if (local_268 != (void *)0x0) {
    operator_delete(local_268);
  }
  std::
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  ::~vector(local_280);
  mnf::Manifold::~Manifold((Manifold *)local_2d8);
  local_238._0_8_ = &PTR__SO3_00124968;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap
            ((ReusableTemporaryMap *)((long)&local_238 + 0x58));
  mnf::Manifold::~Manifold(&local_238.super_Manifold);
  mnf::Manifold::~Manifold((Manifold *)local_480);
  local_120[0] = std::terminate;
  free(local_b8);
  free(local_c8);
  mnf::Manifold::~Manifold((Manifold *)local_120);
  local_a8[0] = std::terminate;
  free(local_40);
  free(local_50);
  mnf::Manifold::~Manifold((Manifold *)local_a8);
  local_198[0] = std::terminate;
  free(local_130);
  free(local_140);
  mnf::Manifold::~Manifold((Manifold *)local_198);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(isSameTopology)
{
  RealSpace R9(9);
  RealSpace R9b(9);
  RealSpace R3(3);
  S2 s2;
  SO3<ExpMapMatrix> so3;
  CartesianProduct cp(so3, R9);

  BOOST_CHECK(!s2.isSameTopology(R9));
  BOOST_CHECK(!s2.isSameTopology(R9b));
  BOOST_CHECK(!s2.isSameTopology(R3));
  BOOST_CHECK(s2.isSameTopology(s2));
  BOOST_CHECK(!s2.isSameTopology(so3));
  BOOST_CHECK(!s2.isSameTopology(cp));
}